

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_score(ngram_model_t *model,char *word,...)

{
  char in_AL;
  int32 iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_138;
  long *local_120;
  long local_108 [4];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int32 local_54;
  int32 local_50;
  int32 prob;
  int32 n_used;
  int32 n_hist;
  int32 *histid;
  char *hword;
  va_list history;
  char *word_local;
  ngram_model_t *model_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  history[0].overflow_arg_area = local_108;
  history[0]._0_8_ = &stack0x00000008;
  hword._4_4_ = 0x30;
  hword._0_4_ = 0x10;
  prob = 0;
  while( true ) {
    if ((uint)hword < 0x29) {
      local_120 = (long *)((long)history[0].overflow_arg_area + (long)(int)(uint)hword);
      hword._0_4_ = (uint)hword + 8;
    }
    else {
      local_120 = (long *)history[0]._0_8_;
      history[0]._0_8_ = history[0]._0_8_ + 8;
    }
    histid = (int32 *)*local_120;
    if (histid == (int32 *)0x0) break;
    prob = prob + 1;
  }
  local_108[2] = in_RDX;
  local_108[3] = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  _n_used = (int32 *)__ckd_calloc__((long)prob,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x1a6);
  history[0].overflow_arg_area = local_108;
  history[0]._0_8_ = &stack0x00000008;
  hword._4_4_ = 0x30;
  hword._0_4_ = 0x10;
  prob = 0;
  while( true ) {
    if ((uint)hword < 0x29) {
      local_138 = (undefined8 *)((long)(int)(uint)hword + (long)history[0].overflow_arg_area);
      hword._0_4_ = (uint)hword + 8;
    }
    else {
      local_138 = (undefined8 *)history[0]._0_8_;
      history[0]._0_8_ = history[0]._0_8_ + 8;
    }
    histid = (int32 *)*local_138;
    if (histid == (int32 *)0x0) break;
    iVar1 = ngram_wid(model,(char *)histid);
    _n_used[prob] = iVar1;
    prob = prob + 1;
  }
  iVar1 = ngram_wid(model,word);
  local_54 = ngram_ng_score(model,iVar1,_n_used,prob,&local_50);
  ckd_free(_n_used);
  return local_54;
}

Assistant:

int32
ngram_score(ngram_model_t * model, const char *word, ...)
{
    va_list history;
    const char *hword;
    int32 *histid;
    int32 n_hist;
    int32 n_used;
    int32 prob;

    va_start(history, word);
    n_hist = 0;
    while ((hword = va_arg(history, const char *)) != NULL)
        ++n_hist;
    va_end(history);

    histid = ckd_calloc(n_hist, sizeof(*histid));
    va_start(history, word);
    n_hist = 0;
    while ((hword = va_arg(history, const char *)) != NULL) {
        histid[n_hist] = ngram_wid(model, hword);
        ++n_hist;
    }
    va_end(history);

    prob = ngram_ng_score(model, ngram_wid(model, word),
                          histid, n_hist, &n_used);
    ckd_free(histid);
    return prob;
}